

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O0

void __thiscall
Apple::II::VideoSwitches<Cycles>::set_character_rom
          (VideoSwitches<Cycles> *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *rom)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uchar *graphic;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rom_local;
  VideoSwitches<Cycles> *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->character_rom_,rom);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->character_rom_,0x121);
  if ((*pvVar3 == '<') ||
     (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->character_rom_,0x122), *pvVar3 == '<')) {
    __end4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                       (&this->character_rom_);
    graphic = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 (&this->character_rom_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&graphic), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end4);
      bVar2 = 0;
      if ((*pbVar4 & 1) != 0) {
        bVar2 = 0x40;
      }
      bVar5 = 0;
      if ((*pbVar4 & 2) != 0) {
        bVar5 = 0x20;
      }
      bVar6 = 0;
      if ((*pbVar4 & 4) != 0) {
        bVar6 = 0x10;
      }
      bVar7 = 0;
      if ((*pbVar4 & 8) != 0) {
        bVar7 = 8;
      }
      bVar8 = 0;
      if ((*pbVar4 & 0x10) != 0) {
        bVar8 = 4;
      }
      bVar9 = 0;
      if ((*pbVar4 & 0x20) != 0) {
        bVar9 = 2;
      }
      *pbVar4 = bVar2 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9 | (*pbVar4 & 0x40) != 0;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end4);
    }
  }
  return;
}

Assistant:

void set_character_rom(const std::vector<uint8_t> &rom) {
			character_rom_ = rom;

			// There's some inconsistency in bit ordering amongst the common ROM dumps;
			// detect that based arbitrarily on the second line of the $ graphic and
			// ensure consistency.
			if(character_rom_[0x121] == 0x3c || character_rom_[0x122] == 0x3c) {
				for(auto &graphic : character_rom_) {
					graphic =
						((graphic & 0x01) ? 0x40 : 0x00) |
						((graphic & 0x02) ? 0x20 : 0x00) |
						((graphic & 0x04) ? 0x10 : 0x00) |
						((graphic & 0x08) ? 0x08 : 0x00) |
						((graphic & 0x10) ? 0x04 : 0x00) |
						((graphic & 0x20) ? 0x02 : 0x00) |
						((graphic & 0x40) ? 0x01 : 0x00);
				}
			}
		}